

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O0

void board::makemove::clearPiece(int square,Board *pos)

{
  int piece_00;
  int iVar1;
  uint64_t *puVar2;
  int *piVar3;
  int local_28;
  int local_24;
  int i;
  int targetPNum;
  int color;
  int piece;
  Board *pos_local;
  int square_local;
  
  piece_00 = Board::getSquare(pos,square);
  iVar1 = Board::PIECE_COLOR[piece_00];
  local_24 = -1;
  Board::addMaterial(pos,iVar1,-Board::PIECE_VAL[piece_00]);
  Board::hashPiece(pos,piece_00,square);
  Board::setSquare(pos,square,0);
  if (Board::PIECE_NO_TEAM[piece_00] == 1) {
    puVar2 = Board::getPawns(pos);
    bitboard::clearBit(puVar2 + iVar1,Board::SQ64[square]);
    puVar2 = Board::getPawns(pos);
    bitboard::clearBit(puVar2 + 2,Board::SQ64[square]);
  }
  local_28 = 0;
  do {
    iVar1 = Board::getPieceNum(pos,piece_00);
    if (iVar1 <= local_28) {
LAB_00152e8e:
      Board::decrementPieceNum(pos,piece_00);
      piVar3 = Board::getPieceList(pos,piece_00);
      iVar1 = Board::getPieceNum(pos,piece_00);
      iVar1 = piVar3[iVar1];
      piVar3 = Board::getPieceList(pos,piece_00);
      piVar3[local_24] = iVar1;
      return;
    }
    piVar3 = Board::getPieceList(pos,piece_00);
    if (piVar3[local_28] == square) {
      local_24 = local_28;
      goto LAB_00152e8e;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

inline void board::makemove::clearPiece(const int square, Board& pos)
{
    int piece = pos.getSquare(square);
    int color = Board::PIECE_COLOR[piece];
    int targetPNum = -1;
    pos.addMaterial(color, -1 * Board::PIECE_VAL[piece]);
    pos.hashPiece(piece, square);
    pos.setSquare(square, EMPTY);
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        bitboard::clearBit(pos.getPawns()[color], Board::SQ64[square]);
        bitboard::clearBit(pos.getPawns()[BOTH], Board::SQ64[square]);
    }
    for (int i = 0; i < pos.getPieceNum(piece); i++) {
        if (pos.getPieceList(piece)[i] == square) {
            targetPNum = i;
            break;
        }
    }
    pos.decrementPieceNum(piece);
    pos.getPieceList(piece)[targetPNum] = pos.getPieceList(piece)[pos.getPieceNum(piece)];
}